

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

bool __thiscall
libtorrent::dht::dht_tracker::send_packet
          (dht_tracker *this,listen_socket_handle *s,entry *e,endpoint *addr)

{
  counters *pcVar1;
  dht_observer *pdVar2;
  anon_class_8_1_898948ef_for__M_pred aVar3;
  endpoint *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  entry *peVar7;
  size_type sVar8;
  pointer __args;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void> local_109;
  span<const_char> local_108;
  bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void> local_f1;
  span<const_char> local_f0;
  _Self local_e0;
  endpoint *local_d8;
  _Base_ptr local_d0;
  _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
  local_c8;
  _Self local_c0;
  _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
  n;
  endpoint local_b0;
  tcp local_94;
  undefined1 local_90 [8];
  error_code ec;
  string_view local_78 [2];
  allocator<char> local_51;
  string_type local_50;
  anon_class_8_1_898948ef_for__M_pred local_30;
  endpoint *addr_local;
  entry *e_local;
  listen_socket_handle *s_local;
  dht_tracker *this_local;
  
  local_30.addr = addr;
  addr_local = (endpoint *)e;
  e_local = (entry *)s;
  s_local = (listen_socket_handle *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<char_const*,void>
            ((string *)&local_50,"LT\x02\x10","N10libtorrent3dht11dht_trackerE",&local_51);
  this_00 = addr_local;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_78,"v");
  peVar7 = entry::operator[]((entry *)this_00,local_78[0]);
  entry::operator=(peVar7,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::allocator<char>::~allocator(&local_51);
  ::std::vector<char,_std::allocator<char>_>::clear(&this->m_send_buf);
  ec.cat_ = (error_category *)
            ::std::back_inserter<std::vector<char,std::allocator<char>>>(&this->m_send_buf);
  bencode<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            ((back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)ec.cat_,
             (entry *)addr_local);
  sVar8 = ::std::vector<char,_std::allocator<char>_>::size(&this->m_send_buf);
  this->m_send_quota = this->m_send_quota - (int)sVar8;
  boost::system::error_code::error_code((error_code *)local_90);
  libtorrent::aux::listen_socket_handle::get_local_endpoint
            (&local_b0,(listen_socket_handle *)e_local);
  local_94.family_ = (int)boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::protocol(&local_b0)
  ;
  iVar5 = boost::asio::ip::tcp::family(&local_94);
  n._M_node._4_4_ = boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::protocol(local_30.addr);
  iVar6 = boost::asio::ip::udp::family((udp *)((long)&n._M_node + 4));
  peVar7 = e_local;
  aVar3.addr = (endpoint *)local_30;
  if (iVar5 == iVar6) {
    span<char_const>::span<std::vector<char,std::allocator<char>>,char,void>
              ((span<char_const> *)&local_108,&this->m_send_buf);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>::
    bitfield_flag(&local_109);
    ::std::
    function<void_(const_libtorrent::aux::listen_socket_handle_&,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
    ::operator()(&this->m_send_fun,(listen_socket_handle *)peVar7,aVar3.addr,local_108,
                 (error_code *)local_90,local_109);
  }
  else {
    local_c8._M_node =
         (_Base_ptr)
         ::std::
         map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
         ::begin(&this->m_nodes);
    local_d0 = (_Base_ptr)
               ::std::
               map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
               ::end(&this->m_nodes);
    local_d8 = local_30.addr;
    local_c0._M_node =
         (_Base_ptr)
         ::std::
         find_if<std::_Rb_tree_iterator<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>,libtorrent::dht::dht_tracker::send_packet(libtorrent::aux::listen_socket_handle_const&,libtorrent::entry&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&)::__0>
                   (local_c8,(_Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
                              )local_d0,local_30);
    local_e0._M_node =
         (_Base_ptr)
         ::std::
         map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
         ::end(&this->m_nodes);
    bVar4 = ::std::operator!=(&local_c0,&local_e0);
    if (bVar4) {
      __args = ::std::
               _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
               ::operator->(&local_c0);
      aVar3.addr = (endpoint *)local_30;
      span<char_const>::span<std::vector<char,std::allocator<char>>,char,void>
                ((span<char_const> *)&local_f0,&this->m_send_buf);
      libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>::
      bitfield_flag(&local_f1);
      ::std::
      function<void_(const_libtorrent::aux::listen_socket_handle_&,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
      ::operator()(&this->m_send_fun,&__args->first,aVar3.addr,local_f0,(error_code *)local_90,
                   local_f1);
    }
    else {
      boost::system::error_code::operator=((error_code *)local_90,address_family_not_supported);
    }
  }
  bVar4 = boost::system::error_code::operator_cast_to_bool((error_code *)local_90);
  if (bVar4) {
    counters::inc_stats_counter(this->m_counters,0x8c,1);
    pdVar2 = this->m_log;
    span<char_const>::span<std::vector<char,std::allocator<char>>,char,void>
              ((span<char_const> *)&local_120,&this->m_send_buf);
    (*(pdVar2->super_dht_logger)._vptr_dht_logger[2])(pdVar2,1,local_120,local_118,local_30.addr);
    this_local._7_1_ = false;
  }
  else {
    pcVar1 = this->m_counters;
    sVar8 = ::std::vector<char,_std::allocator<char>_>::size(&this->m_send_buf);
    counters::inc_stats_counter(pcVar1,0x8e,(long)(int)sVar8);
    pcVar1 = this->m_counters;
    bVar4 = libtorrent::aux::is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
                      (local_30.addr);
    iVar5 = 0x1c;
    if (bVar4) {
      iVar5 = 0x30;
    }
    counters::inc_stats_counter(pcVar1,0x81,(long)iVar5);
    counters::inc_stats_counter(this->m_counters,0x8b,1);
    pdVar2 = this->m_log;
    span<char_const>::span<std::vector<char,std::allocator<char>>,char,void>
              ((span<char_const> *)&local_130,&this->m_send_buf);
    (*(pdVar2->super_dht_logger)._vptr_dht_logger[2])(pdVar2,1,local_130,local_128,local_30.addr);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool dht_tracker::send_packet(aux::listen_socket_handle const& s, entry& e, udp::endpoint const& addr)
	{
		TORRENT_ASSERT(m_nodes.find(s) != m_nodes.end());

		static_assert(lt::version_minor < 16, "version number not supported by DHT");
		static_assert(lt::version_tiny < 16, "version number not supported by DHT");
		static char const ver[] = {'L', 'T'
			, lt::version_major, (lt::version_minor << 4) | lt::version_tiny};
		e["v"] = std::string(ver, ver+ 4);

		m_send_buf.clear();
		bencode(std::back_inserter(m_send_buf), e);

		// update the quota. We won't prevent the packet to be sent if we exceed
		// the quota, we'll just (potentially) block the next incoming request.

		m_send_quota -= int(m_send_buf.size());

		error_code ec;
		if (s.get_local_endpoint().protocol().family() != addr.protocol().family())
		{
			// the node is trying to send a packet to a different address family
			// than its socket, this can happen during bootstrap
			// pick a node with the right address family and use its socket
			auto n = std::find_if(m_nodes.begin(), m_nodes.end()
				, [&](tracker_nodes_t::value_type const& v)
					{ return v.first.get_local_endpoint().protocol().family() == addr.protocol().family(); });

			if (n != m_nodes.end())
				m_send_fun(n->first, addr, m_send_buf, ec, {});
			else
				ec = boost::asio::error::address_family_not_supported;
		}
		else
		{
			m_send_fun(s, addr, m_send_buf, ec, {});
		}

		if (ec)
		{
			m_counters.inc_stats_counter(counters::dht_messages_out_dropped);
#ifndef TORRENT_DISABLE_LOGGING
			m_log->log_packet(dht_logger::outgoing_message, m_send_buf, addr);
#endif
			return false;
		}

		m_counters.inc_stats_counter(counters::dht_bytes_out, int(m_send_buf.size()));
		// account for IP and UDP overhead
		m_counters.inc_stats_counter(counters::sent_ip_overhead_bytes
			, aux::is_v6(addr) ? 48 : 28);
		m_counters.inc_stats_counter(counters::dht_messages_out);
#ifndef TORRENT_DISABLE_LOGGING
		m_log->log_packet(dht_logger::outgoing_message, m_send_buf, addr);
#endif
		return true;
	}